

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::WriteCommandScript
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *customStep,cmGeneratorTarget *target)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  string cmd;
  ofstream script;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (target == (cmGeneratorTarget *)0x0) {
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_((string *)&script,target);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&script);
    std::__cxx11::string::~string((string *)&script);
  }
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::ofstream::ofstream(&script,(__return_storage_ptr__->_M_dataplus)._M_p,_S_out);
  std::operator<<(&script.super_basic_ostream<char,_std::char_traits<char>_>,"set -e\n\n");
  pbVar1 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (cmdLines->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&cmd,(string *)pbVar3);
    cmsys::SystemTools::ReplaceString(&cmd,"$$","$");
    poVar2 = std::operator<<(&script.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&cmd);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&cmd);
  }
  std::ofstream::~ofstream(&script);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::WriteCommandScript(
  std::vector<std::string> const& cmdLines, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  std::string scriptPath;
  if (target) {
    scriptPath = target->GetSupportDirectory();
  } else {
    scriptPath = this->GetCurrentBinaryDirectory();
    scriptPath += "/CMakeFiles";
  }
  cmSystemTools::MakeDirectory(scriptPath);
  scriptPath += '/';
  scriptPath += customStep;
#ifdef _WIN32
  scriptPath += ".bat";
#else
  scriptPath += ".sh";
#endif

  cmsys::ofstream script(scriptPath.c_str());

#ifdef _WIN32
  script << "@echo off\n";
  int line = 1;
#else
  script << "set -e\n\n";
#endif

  for (auto const& i : cmdLines) {
    std::string cmd = i;
    // The command line was built assuming it would be written to
    // the build.ninja file, so it uses '$$' for '$'.  Remove this
    // for the raw shell script.
    cmSystemTools::ReplaceString(cmd, "$$", "$");
#ifdef _WIN32
    script << cmd << " || (set FAIL_LINE=" << ++line << "& goto :ABORT)"
           << '\n';
#else
    script << cmd << '\n';
#endif
  }

#ifdef _WIN32
  script << "goto :EOF\n\n"
            ":ABORT\n"
            "set ERROR_CODE=%ERRORLEVEL%\n"
            "echo Batch file failed at line %FAIL_LINE% "
            "with errorcode %ERRORLEVEL%\n"
            "exit /b %ERROR_CODE%";
#endif

  return scriptPath;
}